

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# work_thread.cpp
# Opt level: O1

void __thiscall cooper::work_thread::thread_func(work_thread *this)

{
  bool bVar1;
  long *in_RAX;
  pointer *__ptr;
  undefined8 local_28;
  
  local_28 = in_RAX;
  do {
    if (((this->quit_)._M_base._M_i & 1U) != 0) {
      bVar1 = thread_queue<cooper::func_wrapper,_std::deque<cooper::func_wrapper,_std::allocator<cooper::func_wrapper>_>_>
              ::empty(&this->que_);
      if (bVar1) {
        return;
      }
    }
    thread_queue<cooper::func_wrapper,_std::deque<cooper::func_wrapper,_std::allocator<cooper::func_wrapper>_>_>
    ::get((thread_queue<cooper::func_wrapper,_std::deque<cooper::func_wrapper,_std::allocator<cooper::func_wrapper>_>_>
           *)&stack0xffffffffffffffd8);
    (**(code **)(*(long *)local_28 + 0x10))();
    if ((long *)local_28 != (long *)0x0) {
      (**(code **)(*(long *)local_28 + 8))();
    }
  } while( true );
}

Assistant:

void work_thread::thread_func()
{
	while (!(quit_ && que_.empty())) {
		try {
			que_.get()();
		}
		catch (...) {}
	}
}